

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flt2vrml.c
# Opt level: O0

faceset * faceset_create(void)

{
  faceset *pfVar1;
  void *pvVar2;
  int *piVar3;
  faceset *fs;
  
  pfVar1 = (faceset *)malloc(0xa0);
  pfVar1->texture_pattern_filename = (char *)0x0;
  pvVar2 = bsp_create(fs._4_4_);
  pfVar1->vertex_colors = pvVar2;
  pvVar2 = bsp_create(fs._4_4_);
  pfVar1->texcoords = pvVar2;
  piVar3 = array_create_int(0);
  pfVar1->indices = piVar3;
  piVar3 = array_create_int(0);
  pfVar1->lineIndices = piVar3;
  piVar3 = array_create_int(0);
  pfVar1->texIndices = piVar3;
  piVar3 = array_create_int(0);
  pfVar1->colorIdx = piVar3;
  pvVar2 = bsp_create(fs._4_4_);
  pfVar1->bspTree = pvVar2;
  return pfVar1;
}

Assistant:

static faceset *
faceset_create()
{
  faceset *fs = (faceset*) malloc(sizeof(faceset));
  fs->texture_pattern_filename = NULL;
  fs->vertex_colors = bsp_create(3);
  fs->texcoords = bsp_create(2);

  fs->indices = array_create_int(4);
  fs->lineIndices = array_create_int(4);
  fs->texIndices = array_create_int(4);
  fs->colorIdx = array_create_int(4);

  fs->bspTree = bsp_create(3);
  return fs;
}